

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsCommon.cpp
# Opt level: O0

void Scs::InitializeInternal(InitParams *params)

{
  bool bVar1;
  byte local_31;
  _func_void_void_ptr *local_30;
  _func_void_ptr_void_ptr_unsigned_long *local_28;
  _func_void_ptr_unsigned_long *local_20;
  _func_void_char_ptr *local_18;
  InitParams *local_10;
  InitParams *params_local;
  
  local_10 = params;
  InitParams::operator=(&s_params,params);
  bVar1 = std::function::operator_cast_to_bool((function *)&s_params);
  if (!bVar1) {
    local_18 = DefaultWriteLine;
    std::function<void(char_const*)>::operator=((function<void(char_const*)> *)&s_params,&local_18);
  }
  bVar1 = std::function::operator_cast_to_bool((function *)&s_params.allocFn);
  if (((!bVar1) ||
      (bVar1 = std::function::operator_cast_to_bool((function *)&s_params.reallocFn), !bVar1)) ||
     (bVar1 = std::function::operator_cast_to_bool((function *)&s_params.freeFn), !bVar1)) {
    bVar1 = std::function::operator_cast_to_bool((function *)&s_params.allocFn);
    local_31 = 0;
    if (!bVar1) {
      bVar1 = std::function::operator_cast_to_bool((function *)&s_params.reallocFn);
      local_31 = 0;
      if (!bVar1) {
        bVar1 = std::function::operator_cast_to_bool((function *)&s_params.freeFn);
        local_31 = bVar1 ^ 0xff;
      }
    }
    if ((local_31 & 1) == 0) {
      __assert_fail("!s_params.allocFn && !s_params.reallocFn && !s_params.freeFn",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsCommon.cpp"
                    ,0x47,"void Scs::InitializeInternal(const InitParams &)");
    }
    local_20 = DefaultAlloc;
    std::function<void*(unsigned_long)>::operator=
              ((function<void*(unsigned_long)> *)&s_params.allocFn,&local_20);
    local_28 = DefaultRealloc;
    std::function<void*(void*,unsigned_long)>::operator=
              ((function<void*(void*,unsigned_long)> *)&s_params.reallocFn,&local_28);
    local_30 = DefaultFree;
    std::function<void(void*)>::operator=((function<void(void*)> *)&s_params.freeFn,&local_30);
  }
  return;
}

Assistant:

void Scs::InitializeInternal(const InitParams & params)
{
	s_params = params;
	if (!s_params.logFn)
		s_params.logFn = &DefaultWriteLine;
	if (!s_params.allocFn || !s_params.reallocFn || !s_params.freeFn)
	{
		// You must define all memory functions or none
		assert(!s_params.allocFn && !s_params.reallocFn && !s_params.freeFn);
		s_params.allocFn = &DefaultAlloc;
		s_params.reallocFn = &DefaultRealloc;
		s_params.freeFn = &DefaultFree;
	}
}